

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

rcode __thiscall olc::Platform_Linux::HandleSystemEvent(Platform_Linux *this)

{
  PixelGameEngine *pPVar1;
  int iVar2;
  byte *pbVar3;
  XKeyEvent *e_1;
  KeySym sym_1;
  XKeyEvent *e;
  KeySym sym;
  XConfigureEvent xce;
  XWindowAttributes gwa;
  XEvent xev;
  Platform_Linux *this_local;
  
  while (iVar2 = XPending(this->olc_Display), iVar2 != 0) {
    XNextEvent(this->olc_Display);
    if ((int)gwa.screen == 0xc) {
      XGetWindowAttributes(this->olc_Display,this->olc_Window,&xce.override_redirect);
      PixelGameEngine::olc_UpdateWindowSize(Platform::ptrPGE,gwa.x,gwa.y);
    }
    else if ((int)gwa.screen == 0x16) {
      memcpy(&sym,&gwa.screen,0x58);
      PixelGameEngine::olc_UpdateWindowSize(Platform::ptrPGE,xce.x,xce.y);
    }
    else if ((int)gwa.screen == 2) {
      e = (XKeyEvent *)XLookupKeysym(&gwa.screen,0);
      pPVar1 = Platform::ptrPGE;
      pbVar3 = std::
               map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
               ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                             *)mapKeys,(key_type *)&e);
      PixelGameEngine::olc_UpdateKeyState(pPVar1,(uint)*pbVar3,true);
      sym_1 = (KeySym)&gwa.screen;
      XLookupString(sym_1,0,0,&e);
      pPVar1 = Platform::ptrPGE;
      pbVar3 = std::
               map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
               ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                             *)mapKeys,(key_type *)&e);
      PixelGameEngine::olc_UpdateKeyState(pPVar1,(uint)*pbVar3,true);
    }
    else if ((int)gwa.screen == 3) {
      e_1 = (XKeyEvent *)XLookupKeysym(&gwa.screen,0);
      pPVar1 = Platform::ptrPGE;
      pbVar3 = std::
               map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
               ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                             *)mapKeys,(key_type *)&e_1);
      PixelGameEngine::olc_UpdateKeyState(pPVar1,(uint)*pbVar3,false);
      XLookupString(&gwa.screen,0,0,&e_1);
      pPVar1 = Platform::ptrPGE;
      pbVar3 = std::
               map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
               ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                             *)mapKeys,(key_type *)&e_1);
      PixelGameEngine::olc_UpdateKeyState(pPVar1,(uint)*pbVar3,false);
    }
    else if ((int)gwa.screen == 4) {
      switch(xev.xkey.y_root) {
      case 1:
        PixelGameEngine::olc_UpdateMouseState(Platform::ptrPGE,0,true);
        break;
      case 2:
        PixelGameEngine::olc_UpdateMouseState(Platform::ptrPGE,2,true);
        break;
      case 3:
        PixelGameEngine::olc_UpdateMouseState(Platform::ptrPGE,1,true);
        break;
      case 4:
        PixelGameEngine::olc_UpdateMouseWheel(Platform::ptrPGE,0x78);
        break;
      case 5:
        PixelGameEngine::olc_UpdateMouseWheel(Platform::ptrPGE,-0x78);
      }
    }
    else if ((int)gwa.screen == 5) {
      if (xev.xkey.y_root == 1) {
        PixelGameEngine::olc_UpdateMouseState(Platform::ptrPGE,0,false);
      }
      else if (xev.xkey.y_root == 2) {
        PixelGameEngine::olc_UpdateMouseState(Platform::ptrPGE,2,false);
      }
      else if (xev.xkey.y_root == 3) {
        PixelGameEngine::olc_UpdateMouseState(Platform::ptrPGE,1,false);
      }
    }
    else if ((int)gwa.screen == 6) {
      PixelGameEngine::olc_UpdateMouse
                (Platform::ptrPGE,xev.xexpose.count,xev.xgraphicsexpose.major_code);
    }
    else if ((int)gwa.screen == 9) {
      PixelGameEngine::olc_UpdateKeyFocus(Platform::ptrPGE,true);
    }
    else if ((int)gwa.screen == 10) {
      PixelGameEngine::olc_UpdateKeyFocus(Platform::ptrPGE,false);
    }
    else if ((int)gwa.screen == 0x21) {
      PixelGameEngine::olc_Terminate(Platform::ptrPGE);
    }
  }
  return OK;
}

Assistant:

virtual olc::rcode HandleSystemEvent() override
		{
			using namespace X11;
			// Handle Xlib Message Loop - we do this in the
			// same thread that OpenGL was created so we dont
			// need to worry too much about multithreading with X11
			XEvent xev;
			while (XPending(olc_Display))
			{
				XNextEvent(olc_Display, &xev);
				if (xev.type == Expose)
				{
					XWindowAttributes gwa;
					XGetWindowAttributes(olc_Display, olc_Window, &gwa);
					ptrPGE->olc_UpdateWindowSize(gwa.width, gwa.height);
				}
				else if (xev.type == ConfigureNotify)
				{
					XConfigureEvent xce = xev.xconfigure;
					ptrPGE->olc_UpdateWindowSize(xce.width, xce.height);
				}
				else if (xev.type == KeyPress)
				{
					KeySym sym = XLookupKeysym(&xev.xkey, 0);
					ptrPGE->olc_UpdateKeyState(mapKeys[sym], true);
					XKeyEvent *e = (XKeyEvent *)&xev; // Because DragonEye loves numpads
					XLookupString(e, NULL, 0, &sym, NULL);
					ptrPGE->olc_UpdateKeyState(mapKeys[sym], true);
				}
				else if (xev.type == KeyRelease)
				{
					KeySym sym = XLookupKeysym(&xev.xkey, 0);
					ptrPGE->olc_UpdateKeyState(mapKeys[sym], false);
					XKeyEvent *e = (XKeyEvent *)&xev;
					XLookupString(e, NULL, 0, &sym, NULL);
					ptrPGE->olc_UpdateKeyState(mapKeys[sym], false);
				}
				else if (xev.type == ButtonPress)
				{
					switch (xev.xbutton.button)
					{
					case 1:
						ptrPGE->olc_UpdateMouseState(0, true);
						break;
					case 2:
						ptrPGE->olc_UpdateMouseState(2, true);
						break;
					case 3:
						ptrPGE->olc_UpdateMouseState(1, true);
						break;
					case 4:
						ptrPGE->olc_UpdateMouseWheel(120);
						break;
					case 5:
						ptrPGE->olc_UpdateMouseWheel(-120);
						break;
					default:
						break;
					}
				}
				else if (xev.type == ButtonRelease)
				{
					switch (xev.xbutton.button)
					{
					case 1:
						ptrPGE->olc_UpdateMouseState(0, false);
						break;
					case 2:
						ptrPGE->olc_UpdateMouseState(2, false);
						break;
					case 3:
						ptrPGE->olc_UpdateMouseState(1, false);
						break;
					default:
						break;
					}
				}
				else if (xev.type == MotionNotify)
				{
					ptrPGE->olc_UpdateMouse(xev.xmotion.x, xev.xmotion.y);
				}
				else if (xev.type == FocusIn)
				{
					ptrPGE->olc_UpdateKeyFocus(true);
				}
				else if (xev.type == FocusOut)
				{
					ptrPGE->olc_UpdateKeyFocus(false);
				}
				else if (xev.type == ClientMessage)
				{
					ptrPGE->olc_Terminate();
				}
			}
			return olc::OK;
		}